

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stripctrl.c
# Opt level: O1

void stripctrl_locale_BinarySink_write(BinarySink *bs,void *vp,size_t len)

{
  BinarySink **__s;
  BinarySink **scc;
  BinarySink *pBVar1;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var2;
  int iVar3;
  char *pcVar4;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var5;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var6;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *__n;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var7;
  bool bVar8;
  wchar_t wc;
  wchar_t wc_1;
  wchar_t local_48;
  wchar_t local_44;
  BinarySink *local_40;
  char *local_38;
  
  scc = &bs[-7].binarysink_;
  pcVar4 = setlocale(0,(char *)0x0);
  local_38 = dupstr(pcVar4);
  setlocale(0,anon_var_dwarf_34748 + 10);
  __s = &bs[-6].binarysink_;
  local_40 = bs;
  do {
    p_Var5 = bs[-3].writefmtv;
    if (p_Var5 == (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0) goto LAB_0016ca12;
    p_Var7 = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)(0x40 - (long)p_Var5);
    __n = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)len;
    if (p_Var7 < len) {
      __n = p_Var7;
    }
    memcpy(p_Var5 + (long)__s,vp,(size_t)__n);
    pBVar1 = bs[-7].binarysink_;
    p_Var5 = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)
             mbrtowc(&local_48,(char *)__s,(size_t)(bs[-3].writefmtv + (long)__n),(mbstate_t *)scc);
    if (p_Var5 == (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0) {
      stripctrl_locale_put_wc((StripCtrlCharsImpl *)scc,L'\0');
LAB_0016c984:
      p_Var5 = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x1;
    }
    else {
      if (p_Var5 == (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0xffffffffffffffff) {
        *scc = (BinarySink *)0x0;
        goto LAB_0016c984;
      }
      if (p_Var5 == (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0xfffffffffffffffe) {
        *scc = pBVar1;
        p_Var5 = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0;
      }
      else {
        stripctrl_locale_put_wc((StripCtrlCharsImpl *)scc,local_48);
      }
    }
    bs = local_40;
    p_Var2 = local_40[-3].writefmtv;
    p_Var6 = p_Var5 + -(long)p_Var2;
    if (p_Var5 < p_Var2) {
      if (p_Var5 == (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0) {
        if (p_Var7 < len) {
          __assert_fail("to_copy == len",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/stripctrl.c"
                        ,0x15f,
                        "void stripctrl_locale_BinarySink_write(BinarySink *, const void *, size_t)"
                       );
        }
        local_40[-3].writefmtv = p_Var2 + (long)__n;
        iVar3 = 4;
      }
      else {
        local_40[-3].writefmtv = p_Var2 + -(long)p_Var5;
        memmove(__s,p_Var5 + (long)__s,(size_t)(p_Var2 + -(long)p_Var5));
        iVar3 = 0;
      }
    }
    else {
      bVar8 = len < p_Var6;
      len = len + -(long)p_Var6;
      if (bVar8) {
        __assert_fail("consumed_from_main_string <= len",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/stripctrl.c"
                      ,0x14d,
                      "void stripctrl_locale_BinarySink_write(BinarySink *, const void *, size_t)");
      }
      vp = (void *)((long)vp + (long)p_Var6);
      local_40[-3].writefmtv = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0;
      iVar3 = 3;
    }
  } while (iVar3 == 0);
  if (iVar3 != 4) {
LAB_0016ca12:
    do {
      if ((_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)len ==
          (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0) {
        len = 0;
        break;
      }
      pBVar1 = *scc;
      p_Var5 = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)
               mbrtowc(&local_44,(char *)vp,len,(mbstate_t *)scc);
      if (p_Var5 == (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0) {
        stripctrl_locale_put_wc((StripCtrlCharsImpl *)scc,L'\0');
LAB_0016ca62:
        p_Var5 = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x1;
      }
      else {
        if (p_Var5 == (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0xffffffffffffffff) {
          *scc = (BinarySink *)0x0;
          goto LAB_0016ca62;
        }
        if (p_Var5 == (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0xfffffffffffffffe) {
          *scc = pBVar1;
          p_Var5 = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0;
        }
        else {
          stripctrl_locale_put_wc((StripCtrlCharsImpl *)scc,local_44);
        }
      }
      if (p_Var5 != (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0) {
        bVar8 = len < p_Var5;
        len = len + -(long)p_Var5;
        if (bVar8) {
          __assert_fail("consumed <= len",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/stripctrl.c"
                        ,0x17b,
                        "void stripctrl_locale_BinarySink_write(BinarySink *, const void *, size_t)"
                       );
        }
        vp = (void *)((long)vp + (long)p_Var5);
      }
      bs = local_40;
    } while (p_Var5 != (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0);
    if ((_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x40 < len) {
      __assert_fail("len <= SCC_BUFSIZE",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/stripctrl.c"
                    ,0x184,
                    "void stripctrl_locale_BinarySink_write(BinarySink *, const void *, size_t)");
    }
    memcpy(__s,vp,len);
    bs[-3].writefmtv = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)len;
  }
  pcVar4 = local_38;
  setlocale(0,local_38);
  safefree(pcVar4);
  return;
}

Assistant:

static void stripctrl_locale_BinarySink_write(
    BinarySink *bs, const void *vp, size_t len)
{
    StripCtrlChars *sccpub = BinarySink_DOWNCAST(bs, StripCtrlChars);
    StripCtrlCharsImpl *scc =
        container_of(sccpub, StripCtrlCharsImpl, public);
    const char *p = (const char *)vp;

    char *previous_locale = dupstr(setlocale(LC_CTYPE, NULL));
    setlocale(LC_CTYPE, "");

    /*
     * Deal with any partial multibyte character buffered from last
     * time.
     */
    while (scc->buflen > 0) {
        size_t to_copy = SCC_BUFSIZE - scc->buflen;
        if (to_copy > len)
            to_copy = len;

        memcpy(scc->buf + scc->buflen, p, to_copy);
        size_t consumed = stripctrl_locale_try_consume(
            scc, scc->buf, scc->buflen + to_copy);

        if (consumed >= scc->buflen) {
            /*
             * We've consumed a multibyte character that includes all
             * the data buffered from last time. So we can clear our
             * buffer and move on to processing the main input string
             * in situ, having first discarded whatever initial
             * segment of it completed our previous character.
             */
            size_t consumed_from_main_string = consumed - scc->buflen;
            assert(consumed_from_main_string <= len);
            p += consumed_from_main_string;
            len -= consumed_from_main_string;
            scc->buflen = 0;
            break;
        }

        if (consumed == 0) {
            /*
             * If we didn't manage to consume anything, i.e. the whole
             * buffer contains an incomplete sequence, it had better
             * be because our entire input string _this_ time plus
             * whatever leftover data we had from _last_ time still
             * comes to less than SCC_BUFSIZE. In other words, we've
             * already copied all the new data on to the end of our
             * buffer, and it still hasn't helped. So increment buflen
             * to reflect the new data, and return.
             */
            assert(to_copy == len);
            scc->buflen += to_copy;
            goto out;
        }

        /*
         * Otherwise, we've somehow consumed _less_ data than we had
         * buffered, and yet we weren't able to consume that data in
         * the last call to this function. That sounds impossible, but
         * I can think of one situation in which it could happen: if
         * we had an incomplete MB sequence last time, and now more
         * data has arrived, it turns out to be an _illegal_ one, so
         * we consume one byte in the hope of resynchronising.
         *
         * Anyway, in this case we move the buffer up and go back
         * round this initial loop.
         */
        scc->buflen -= consumed;
        memmove(scc->buf, scc->buf + consumed, scc->buflen);
    }

    /*
     * Now charge along the main string.
     */
    while (len > 0) {
        size_t consumed = stripctrl_locale_try_consume(scc, p, len);
        if (consumed == 0)
            break;
        assert(consumed <= len);
        p += consumed;
        len -= consumed;
    }

    /*
     * Any data remaining should be copied into our buffer, to keep
     * for next time.
     */
    assert(len <= SCC_BUFSIZE);
    memcpy(scc->buf, p, len);
    scc->buflen = len;

  out:
    setlocale(LC_CTYPE, previous_locale);
    sfree(previous_locale);
}